

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O0

void __thiscall TinyGC::AttachCurrentThread(TinyGC *this)

{
  ThreadState *this_00;
  id local_50;
  pair<std::thread::id,_TinyGC::ThreadState_*> local_48 [2];
  ThreadState *local_28;
  ThreadState *thread_state;
  unique_lock<std::mutex> lck;
  TinyGC *this_local;
  
  lck._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&thread_state,&this->ts_mxt_)
  ;
  this_00 = (ThreadState *)operator_new(0x20);
  ThreadState::ThreadState(this_00,false);
  local_28 = this_00;
  local_50 = ThreadState::GetThreadId(this_00);
  std::pair<std::thread::id,_TinyGC::ThreadState_*>::
  pair<std::thread::id,_TinyGC::ThreadState_*&,_true>(local_48,&local_50,&local_28);
  std::
  unordered_map<std::thread::id,TinyGC::ThreadState*,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>>
  ::insert<std::pair<std::thread::id,TinyGC::ThreadState*>>
            ((unordered_map<std::thread::id,TinyGC::ThreadState*,std::hash<std::thread::id>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>>
              *)&this->thread_to_stack_,local_48);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&thread_state);
  return;
}

Assistant:

void TinyGC::AttachCurrentThread() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  auto thread_state = new ThreadState();
  thread_to_stack_.insert(std::pair<std::thread::id, ThreadState *>(
      thread_state->GetThreadId(), thread_state));
  // LOG("thread id is " << thread_state->GetThreadId());
  // LOG("stack start address " << thread_state->GetStackStartAddr());
  // LOG("stack end address " << thread_state->GetStackEndAddr());
}